

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::Reflection::AddMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  bool bVar1;
  CppType CVar2;
  int iVar3;
  Reflection *pRVar4;
  Descriptor *actual;
  Descriptor *pDVar5;
  ExtensionSet *this_00;
  MapFieldBase *this_01;
  undefined4 extraout_var;
  Arena *arena;
  Message *local_48;
  Message *prototype;
  RepeatedPtrFieldBase *repeated;
  Message *result;
  MessageFactory *factory_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pRVar4 = Message::GetReflection(message);
  if (this != pRVar4) {
    pDVar5 = this->descriptor_;
    actual = Message::GetDescriptor(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar5,actual,field,"AddMessage");
  }
  pDVar5 = FieldDescriptor::containing_type(field);
  if (pDVar5 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"AddMessage","Field does not match message type.");
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if (!bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"AddMessage",
               "Field is singular; the method requires a repeated field.");
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 != CPPTYPE_MESSAGE) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,field,"AddMessage",CPPTYPE_MESSAGE);
  }
  result = (Message *)factory;
  if (factory == (MessageFactory *)0x0) {
    result = (Message *)this->message_factory_;
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,message);
    this_local = (Reflection *)
                 internal::ExtensionSet::AddMessage(this_00,field,(MessageFactory *)result);
  }
  else {
    bVar1 = anon_unknown_6::IsMapFieldInApi(field);
    if (bVar1) {
      this_01 = MutableRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
      prototype = (Message *)internal::MapFieldBase::MutableRepeatedField(this_01);
    }
    else {
      prototype = (Message *)
                  MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
    }
    repeated = (RepeatedPtrFieldBase *)
               internal::RepeatedPtrFieldBase::
               AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                         ((RepeatedPtrFieldBase *)prototype);
    if (repeated == (RepeatedPtrFieldBase *)0x0) {
      iVar3 = internal::RepeatedPtrFieldBase::size((RepeatedPtrFieldBase *)prototype);
      if (iVar3 == 0) {
        pDVar5 = FieldDescriptor::message_type(field);
        iVar3 = (*(result->super_MessageLite)._vptr_MessageLite[2])(result,pDVar5);
        local_48 = (Message *)CONCAT44(extraout_var,iVar3);
      }
      else {
        local_48 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                             ((RepeatedPtrFieldBase *)prototype,0);
      }
      arena = MessageLite::GetArena(&message->super_MessageLite);
      repeated = (RepeatedPtrFieldBase *)Message::New(local_48,arena);
      internal::RepeatedPtrFieldBase::
      UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                ((RepeatedPtrFieldBase *)prototype,
                 (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_>
                  *)repeated);
    }
    this_local = (Reflection *)repeated;
  }
  return (Message *)this_local;
}

Assistant:

Message* Reflection::AddMessage(Message* message, const FieldDescriptor* field,
                                MessageFactory* factory) const {
  USAGE_MUTABLE_CHECK_ALL(AddMessage, REPEATED, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->AddMessage(field, factory));
  } else {
    Message* result = nullptr;

    // We can't use AddField<Message>() because RepeatedPtrFieldBase doesn't
    // know how to allocate one.
    RepeatedPtrFieldBase* repeated = nullptr;
    if (IsMapFieldInApi(field)) {
      repeated =
          MutableRaw<MapFieldBase>(message, field)->MutableRepeatedField();
    } else {
      repeated = MutableRaw<RepeatedPtrFieldBase>(message, field);
    }
    result = repeated->AddFromCleared<GenericTypeHandler<Message> >();
    if (result == nullptr) {
      // We must allocate a new object.
      const Message* prototype;
      if (repeated->size() == 0) {
        prototype = factory->GetPrototype(field->message_type());
      } else {
        prototype = &repeated->Get<GenericTypeHandler<Message> >(0);
      }
      result = prototype->New(message->GetArena());
      // We can guarantee here that repeated and result are either both heap
      // allocated or arena owned. So it is safe to call the unsafe version
      // of AddAllocated.
      repeated->UnsafeArenaAddAllocated<GenericTypeHandler<Message> >(result);
    }

    return result;
  }
}